

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O2

void __thiscall DIS::ExpendableReload::unmarshal(ExpendableReload *this,DataStream *dataStream)

{
  EntityType::unmarshal(&this->_expendable,dataStream);
  DataStream::operator>>(dataStream,&this->_station);
  DataStream::operator>>(dataStream,&this->_standardQuantity);
  DataStream::operator>>(dataStream,&this->_maximumQuantity);
  DataStream::operator>>(dataStream,&this->_standardQuantityReloadTime);
  DataStream::operator>>(dataStream,&this->_maximumQuantityReloadTime);
  return;
}

Assistant:

void ExpendableReload::unmarshal(DataStream& dataStream)
{
    _expendable.unmarshal(dataStream);
    dataStream >> _station;
    dataStream >> _standardQuantity;
    dataStream >> _maximumQuantity;
    dataStream >> _standardQuantityReloadTime;
    dataStream >> _maximumQuantityReloadTime;
}